

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglConfigList.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::ConfigList::iterate(ConfigList *this)

{
  TestLog *this_00;
  Library *egl;
  EGLDisplay display;
  Enum<int,_2UL> *value;
  Enum<int,_2UL> *value_00;
  Bitfield<16UL> *value_01;
  Bitfield<16UL> *value_02;
  Bitfield<16UL> *value_03;
  Enum<int,_2UL> *value_04;
  long lVar1;
  EGLint val;
  vector<void_*,_std::allocator<void_*>_> configs;
  string conformant;
  string caveat;
  qpEglConfigInfo info;
  string surfaceTypes;
  string renderableTypes;
  string colorBufferType;
  string transparentType;
  int local_1cc;
  _Vector_base<void_*,_std::allocator<void_*>_> local_1c8;
  TestLog *local_1b0;
  ConfigList *local_1a8;
  string local_1a0;
  string local_180;
  qpEglConfigInfo local_160;
  code *local_c0;
  int local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a8 = this;
  display = eglu::getAndInitDisplay
                      ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                       .m_data.ptr,(Version *)0x0);
  eglu::getConfigs((vector<void_*,_std::allocator<void_*>_> *)&local_1c8,egl,display);
  local_1b0 = this_00;
  tcu::TestLog::startEglConfigSet(this_00,"EGL-configs","List of all EGL configs");
  for (lVar1 = 0;
      lVar1 < (int)((ulong)((long)local_1c8._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1c8._M_impl.super__Vector_impl_data._M_start) >> 3);
      lVar1 = lVar1 + 1) {
    local_1cc = 0;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3020,
               &local_1cc);
    local_160.bufferSize = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3024,
               &local_1cc);
    local_160.redSize = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3023,
               &local_1cc);
    local_160.greenSize = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3022,
               &local_1cc);
    local_160.blueSize = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x303d,
               &local_1cc);
    local_160.luminanceSize = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3021,
               &local_1cc);
    local_160.alphaSize = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x303e,
               &local_1cc);
    local_160.alphaMaskSize = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3039,
               &local_1cc);
    local_160.bindToTextureRGB = (deBool)(local_1cc == 1);
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x303a,
               &local_1cc);
    local_160.bindToTextureRGBA = (deBool)(local_1cc == 1);
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x303f,
               &local_1cc);
    local_180._M_dataplus._M_p = (pointer)eglu::getColorBufferTypeName;
    local_180._M_string_length._0_4_ = local_1cc;
    de::toString<tcu::Format::Enum<int,2ul>>(&local_70,(de *)&local_180,value);
    local_160.colorBufferType = local_70._M_dataplus._M_p;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3027,
               &local_1cc);
    local_1a0._M_dataplus._M_p = (pointer)eglu::getConfigCaveatName;
    local_1a0._M_string_length._0_4_ = local_1cc;
    de::toString<tcu::Format::Enum<int,2ul>>(&local_180,(de *)&local_1a0,value_00);
    local_160.configCaveat = local_180._M_dataplus._M_p;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3028,
               &local_1cc);
    local_160.configID = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3042,
               &local_1cc);
    eglu::getAPIBitsStr((Bitfield<16UL> *)&local_90,local_1cc);
    de::toString<tcu::Format::Bitfield<16ul>>(&local_1a0,(de *)&local_90,value_01);
    local_160.conformant = local_1a0._M_dataplus._M_p;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3025,
               &local_1cc);
    local_160.depthSize = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3029,
               &local_1cc);
    local_160.level = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x302c,
               &local_1cc);
    local_160.maxPBufferWidth = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x302a,
               &local_1cc);
    local_160.maxPBufferHeight = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x302b,
               &local_1cc);
    local_160.maxPBufferPixels = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x303c,
               &local_1cc);
    local_160.maxSwapInterval = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x303b,
               &local_1cc);
    local_160.minSwapInterval = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x302d,
               &local_1cc);
    local_160.nativeRenderable = (deBool)(local_1cc == 1);
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3040,
               &local_1cc);
    eglu::getAPIBitsStr((Bitfield<16UL> *)&local_b0,local_1cc);
    de::toString<tcu::Format::Bitfield<16ul>>(&local_90,(de *)&local_b0,value_02);
    local_160.renderableType = local_90._M_dataplus._M_p;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3032,
               &local_1cc);
    local_160.sampleBuffers = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3031,
               &local_1cc);
    local_160.samples = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3026,
               &local_1cc);
    local_160.stencilSize = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3033,
               &local_1cc);
    eglu::getSurfaceBitsStr((Bitfield<16UL> *)&local_50,local_1cc);
    de::toString<tcu::Format::Bitfield<16ul>>(&local_b0,(de *)&local_50,value_03);
    local_160.surfaceTypes = local_b0._M_dataplus._M_p;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3034,
               &local_1cc);
    local_c0 = eglu::getTransparentTypeName;
    local_b8 = local_1cc;
    de::toString<tcu::Format::Enum<int,2ul>>(&local_50,(de *)&local_c0,value_04);
    local_160.transparentType = local_50._M_dataplus._M_p;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3037,
               &local_1cc);
    local_160.transparentRedValue = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3036,
               &local_1cc);
    local_160.transparentGreenValue = local_1cc;
    (*egl->_vptr_Library[0x19])
              (egl,display,local_1c8._M_impl.super__Vector_impl_data._M_start[lVar1],0x3035,
               &local_1cc);
    local_160.transparentBlueValue = local_1cc;
    tcu::TestLog::writeEglConfig(local_1b0,&local_160);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_70);
  }
  tcu::TestLog::endEglConfigSet(local_1b0);
  (*egl->_vptr_Library[0x34])(egl);
  tcu::TestContext::setTestResult
            ((local_1a8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS
             ,glcts::fixed_sample_locations_values + 1);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_1c8);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ConfigList::iterate (void)
{
	const Library&		egl			= m_eglTestCtx.getLibrary();
	tcu::TestLog&		log			= m_testCtx.getLog();
	EGLDisplay			display		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	vector<EGLConfig>	configs		= eglu::getConfigs(egl, display);

	// \todo [2011-03-23 pyry] Check error codes!

	// \todo [kalle 10/08/2010] Get EGL version.

	log.startEglConfigSet("EGL-configs", "List of all EGL configs");

	// \todo [kalle 10/08/2010] Add validity checks for the values?
	// \todo [kalle 10/08/2010] Adapt for different EGL versions

	for (int i = 0; i < (int)configs.size(); i++)
	{
		qpEglConfigInfo info;
		EGLint val = 0;

		egl.getConfigAttrib(display, configs[i], EGL_BUFFER_SIZE, &val);
		info.bufferSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_RED_SIZE, &val);
		info.redSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_GREEN_SIZE, &val);
		info.greenSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_BLUE_SIZE, &val);
		info.blueSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_LUMINANCE_SIZE, &val);
		info.luminanceSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_ALPHA_SIZE, &val);
		info.alphaSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_ALPHA_MASK_SIZE, &val);
		info.alphaMaskSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_BIND_TO_TEXTURE_RGB, &val);
		info.bindToTextureRGB = val == EGL_TRUE ? DE_TRUE : DE_FALSE;

		egl.getConfigAttrib(display, configs[i], EGL_BIND_TO_TEXTURE_RGBA, &val);
		info.bindToTextureRGBA = val == EGL_TRUE ? DE_TRUE : DE_FALSE;

		egl.getConfigAttrib(display, configs[i], EGL_COLOR_BUFFER_TYPE, &val);
		std::string colorBufferType = de::toString(eglu::getColorBufferTypeStr(val));
		info.colorBufferType = colorBufferType.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_CONFIG_CAVEAT, &val);
		std::string caveat = de::toString(eglu::getConfigCaveatStr(val));
		info.configCaveat = caveat.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_CONFIG_ID, &val);
		info.configID = val;

		egl.getConfigAttrib(display, configs[i], EGL_CONFORMANT, &val);
		std::string conformant = de::toString(eglu::getAPIBitsStr(val));
		info.conformant = conformant.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_DEPTH_SIZE, &val);
		info.depthSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_LEVEL, &val);
		info.level = val;

		egl.getConfigAttrib(display, configs[i], EGL_MAX_PBUFFER_WIDTH, &val);
		info.maxPBufferWidth = val;

		egl.getConfigAttrib(display, configs[i], EGL_MAX_PBUFFER_HEIGHT, &val);
		info.maxPBufferHeight = val;

		egl.getConfigAttrib(display, configs[i], EGL_MAX_PBUFFER_PIXELS, &val);
		info.maxPBufferPixels = val;

		egl.getConfigAttrib(display, configs[i], EGL_MAX_SWAP_INTERVAL, &val);
		info.maxSwapInterval = val;

		egl.getConfigAttrib(display, configs[i], EGL_MIN_SWAP_INTERVAL, &val);
		info.minSwapInterval = val;

		egl.getConfigAttrib(display, configs[i], EGL_NATIVE_RENDERABLE, &val);
		info.nativeRenderable = val == EGL_TRUE ? DE_TRUE : DE_FALSE;

		egl.getConfigAttrib(display, configs[i], EGL_RENDERABLE_TYPE, &val);
		std::string renderableTypes = de::toString(eglu::getAPIBitsStr(val));
		info.renderableType = renderableTypes.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_SAMPLE_BUFFERS, &val);
		info.sampleBuffers = val;

		egl.getConfigAttrib(display, configs[i], EGL_SAMPLES, &val);
		info.samples = val;

		egl.getConfigAttrib(display, configs[i], EGL_STENCIL_SIZE, &val);
		info.stencilSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_SURFACE_TYPE, &val);
		std::string surfaceTypes = de::toString(eglu::getSurfaceBitsStr(val));
		info.surfaceTypes = surfaceTypes.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_TRANSPARENT_TYPE, &val);
		std::string transparentType = de::toString(eglu::getTransparentTypeStr(val));
		info.transparentType = transparentType.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_TRANSPARENT_RED_VALUE, &val);
		info.transparentRedValue = val;

		egl.getConfigAttrib(display, configs[i], EGL_TRANSPARENT_GREEN_VALUE, &val);
		info.transparentGreenValue = val;

		egl.getConfigAttrib(display, configs[i], EGL_TRANSPARENT_BLUE_VALUE, &val);
		info.transparentBlueValue = val;

		log.writeEglConfig(&info);
	}
	log.endEglConfigSet();

	egl.terminate(display);

	getTestContext().setTestResult(QP_TEST_RESULT_PASS, "");

	return TestNode::STOP;
}